

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O1

int trico_read_vec2_double(void *a,double **uv,trico_stream_type st)

{
  long lVar1;
  int iVar2;
  uint32_t *puVar3;
  uint *puVar4;
  bool bVar5;
  uint8_t *puVar6;
  uint unaff_R12D;
  ulong uVar7;
  int iVar8;
  int iVar9;
  uint32_t nr_of_doubles_v;
  uint32_t nr_of_doubles_u;
  double *decompressed_v;
  double *decompressed_u;
  uint local_50;
  uint32_t local_4c;
  uint32_t local_48;
  uint32_t local_44;
  double *local_40;
  double *local_38;
  
  iVar8 = 0;
  iVar9 = 0;
  if (*(trico_stream_type *)((long)a + 0x24) == st) {
    iVar2 = *(int *)((long)a + 0x40);
    bVar5 = true;
    if ((iVar2 == 0) &&
       (puVar3 = *(uint32_t **)((long)a + 0x18),
       (ulong)((long)puVar3 + (4 - *(long *)((long)a + 0x10))) <= *(ulong *)((long)a + 0x30))) {
      local_4c = *puVar3;
      *(uint32_t **)((long)a + 0x18) = puVar3 + 1;
      bVar5 = false;
    }
    iVar9 = iVar8;
    if (!bVar5) {
      bVar5 = true;
      local_50 = unaff_R12D;
      if ((iVar2 == 0) &&
         (puVar4 = *(uint **)((long)a + 0x18),
         (ulong)((long)puVar4 + (4 - *(long *)((long)a + 0x10))) <= *(ulong *)((long)a + 0x30))) {
        local_50 = *puVar4;
        *(uint **)((long)a + 0x18) = puVar4 + 1;
        bVar5 = false;
      }
      if (!bVar5) {
        uVar7 = (ulong)local_50;
        puVar6 = (uint8_t *)malloc(uVar7);
        if (iVar2 == 0) {
          lVar1 = (long)*(void **)((long)a + 0x18) + uVar7;
          if ((ulong)(lVar1 - *(long *)((long)a + 0x10)) <= *(ulong *)((long)a + 0x30)) {
            memcpy(puVar6,*(void **)((long)a + 0x18),uVar7);
            *(long *)((long)a + 0x18) = lVar1;
            trico_decompress_double_precision(&local_44,&local_38,puVar6);
            iVar8 = *(int *)((long)a + 0x40);
            bVar5 = true;
            if ((iVar8 == 0) &&
               (puVar4 = *(uint **)((long)a + 0x18),
               (ulong)((long)puVar4 + (4 - *(long *)((long)a + 0x10))) <= *(ulong *)((long)a + 0x30)
               )) {
              local_50 = *puVar4;
              *(uint **)((long)a + 0x18) = puVar4 + 1;
              bVar5 = false;
            }
            iVar9 = 0;
            if (!bVar5) {
              uVar7 = (ulong)local_50;
              puVar6 = (uint8_t *)realloc(puVar6,uVar7);
              if (iVar8 == 0) {
                lVar1 = (long)*(void **)((long)a + 0x18) + uVar7;
                if ((ulong)(lVar1 - *(long *)((long)a + 0x10)) <= *(ulong *)((long)a + 0x30)) {
                  memcpy(puVar6,*(void **)((long)a + 0x18),uVar7);
                  *(long *)((long)a + 0x18) = lVar1;
                  trico_decompress_double_precision(&local_48,&local_40,puVar6);
                  free(puVar6);
                  if (local_44 != local_4c) {
                    __assert_fail("nr_of_doubles_u == nr_uv_positions",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                  ,0x535,
                                  "int trico_read_vec2_double(void *, double **, enum trico_stream_type)"
                                 );
                  }
                  if (local_48 != local_44) {
                    __assert_fail("nr_of_doubles_v == nr_of_doubles_u",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                  ,0x536,
                                  "int trico_read_vec2_double(void *, double **, enum trico_stream_type)"
                                 );
                  }
                  if (uv != (double **)0x0) {
                    trico_transpose_uv_soa_to_aos_double_precision(uv,local_38,local_40,local_4c);
                  }
                  free(local_38);
                  free(local_40);
                  read_next_stream_type((trico_archive *)a);
                  iVar9 = 1;
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar9;
}

Assistant:

int trico_read_vec2_double(void* a, double** uv, enum trico_stream_type st)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  if (trico_get_next_stream_type(arch) != st)
    return 0;

  uint32_t nr_uv_positions;
  if (!read(&nr_uv_positions, sizeof(uint32_t), 1, arch))
    return 0;

  uint32_t nr_of_compressed_bytes;
  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  void* compressed = trico_malloc(nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  double* decompressed_u;
  uint32_t nr_of_doubles_u;
  trico_decompress_double_precision(&nr_of_doubles_u, &decompressed_u, (const uint8_t*)compressed);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  double* decompressed_v;
  uint32_t nr_of_doubles_v;
  trico_decompress_double_precision(&nr_of_doubles_v, &decompressed_v, (const uint8_t*)compressed);

  trico_free(compressed);

  assert(nr_of_doubles_u == nr_uv_positions);
  assert(nr_of_doubles_v == nr_of_doubles_u);

  if (uv != NULL)
    trico_transpose_uv_soa_to_aos_double_precision(uv, decompressed_u, decompressed_v, nr_uv_positions);

  trico_free(decompressed_u);
  trico_free(decompressed_v);

  read_next_stream_type(arch);

  return 1;
  }